

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.cpp
# Opt level: O0

bool __thiscall
basisu::etc1_optimizer::check_for_redundant_solution
          (etc1_optimizer *this,etc1_solution_coordinates *coords)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  uint8_t *in_RSI;
  long in_RDI;
  uint32_t h1;
  uint32_t h0;
  uint32_t kh;
  undefined1 local_1;
  
  uVar1 = hash_hsieh(in_RSI,3);
  uVar2 = uVar1 & 0x3ff;
  uVar3 = uVar1 >> 10 & 0x3ff;
  if ((((uint)*(byte *)(in_RDI + 0x100 + (ulong)(uVar2 >> 3)) & 1 << ((byte)uVar2 & 7)) == 0) ||
     (((uint)*(byte *)(in_RDI + 0x100 + (ulong)(uVar3 >> 3)) & 1 << ((byte)uVar3 & 7)) == 0)) {
    *(byte *)(in_RDI + 0x100 + (ulong)(uVar2 >> 3)) =
         *(byte *)(in_RDI + 0x100 + (ulong)(uVar2 >> 3)) | (byte)(1 << ((byte)uVar2 & 7));
    *(byte *)(in_RDI + 0x100 + (ulong)(uVar3 >> 3)) =
         *(byte *)(in_RDI + 0x100 + (ulong)(uVar3 >> 3)) | (byte)(1 << ((byte)uVar3 & 7));
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool etc1_optimizer::check_for_redundant_solution(const etc1_solution_coordinates& coords)
	{
		// Hash first 3 bytes of color (RGB)
		uint32_t kh = hash_hsieh((uint8_t*)&coords.m_unscaled_color.r, 3);

		uint32_t h0 = kh & cSolutionsTriedHashMask;
		uint32_t h1 = (kh >> cSolutionsTriedHashBits) & cSolutionsTriedHashMask;

		// Simple Bloom filter lookup with k=2
		if ( ((m_solutions_tried[h0 >> 3] & (1 << (h0 & 7))) != 0) &&
		     ((m_solutions_tried[h1 >> 3] & (1 << (h1 & 7))) != 0) )
			return false;

		m_solutions_tried[h0 >> 3] |= (1 << (h0 & 7));
		m_solutions_tried[h1 >> 3] |= (1 << (h1 & 7));

		return true;
	}